

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O2

void __thiscall CTcSymMetaclass::gen_code(CTcSymMetaclass *this,int discard)

{
  int iVar1;
  undefined1 *puVar2;
  int iVar3;
  CTcGenTarg *pCVar4;
  
  puVar2 = &(this->super_CTcSymMetaclassBase).field_0x58;
  *puVar2 = *puVar2 | 2;
  CTcGenTarg::write_op(G_cg,'\a');
  CTcDataStream::write_obj_id
            (&G_cs->super_CTcDataStream,(ulong)(this->super_CTcSymMetaclassBase).class_obj_);
  pCVar4 = G_cg;
  iVar3 = G_cg->sp_depth_;
  iVar1 = iVar3 + 1;
  G_cg->sp_depth_ = iVar1;
  if (pCVar4->max_sp_depth_ <= iVar3) {
    pCVar4->max_sp_depth_ = iVar1;
  }
  return;
}

Assistant:

void CTcSymMetaclass::gen_code(int discard)
{
    /* 
     *   mark it as referenced - if the metaclass wasn't defined in this file
     *   but was merely imported from a symbol file, we now need to write it
     *   to the object file anyway, since its class object ID has been
     *   referenced 
     */
    ref_ = TRUE;
    
    /* 
     *   the metaclass name refers to the IntrinsicClass instance
     *   associated with the metaclass 
     */
    G_cg->write_op(OPC_PUSHOBJ);
    G_cs->write_obj_id(class_obj_);

    /* note the push */
    G_cg->note_push();
}